

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

VisionFeaturePrint * __thiscall
CoreML::Specification::Model::mutable_visionfeatureprint(Model *this)

{
  VisionFeaturePrint *this_00;
  
  if (this->_oneof_case_[0] == 0x7d2) {
    this_00 = (VisionFeaturePrint *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 0x7d2;
    this_00 = (VisionFeaturePrint *)operator_new(0x20);
    CoreMLModels::VisionFeaturePrint::VisionFeaturePrint(this_00);
    (this->Type_).visionfeatureprint_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::CoreMLModels::VisionFeaturePrint* Model::mutable_visionfeatureprint() {
  if (!has_visionfeatureprint()) {
    clear_Type();
    set_has_visionfeatureprint();
    Type_.visionfeatureprint_ = new ::CoreML::Specification::CoreMLModels::VisionFeaturePrint;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.visionFeaturePrint)
  return Type_.visionfeatureprint_;
}